

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O3

size_t __thiscall Potassco::ProgramOptions::Option::maxColumn(Option *this)

{
  long lVar1;
  byte bVar2;
  char *__s;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  
  lVar1 = (this->name_)._M_string_length + (ulong)(this->value_->optAlias_ != '\0') * 3;
  sVar5 = lVar1 + 4;
  __s = argName(this);
  sVar3 = strlen(__s);
  if (sVar3 == 0) {
    sVar4 = lVar1 + 9;
    if ((this->value_->flags_ & 8) == 0) {
      sVar4 = sVar5;
    }
  }
  else {
    bVar2 = this->value_->flags_;
    sVar4 = sVar3 + sVar5 + (ulong)(bVar2 & 1) * 2 + (ulong)((bVar2 & 8) >> 3) * 3 + 1;
  }
  return sVar4;
}

Assistant:

std::size_t Option::maxColumn() const {
	std::size_t col = 4 + name_.size(); //  --name
	if (alias()) {
		col += 3; // ,-o
	}
	std::size_t argN = strlen(argName());
	if (argN) {
		col += (argN + 1); // =arg
		if (value()->isImplicit()) {
			col += 2; // []
		}
		if (value()->isNegatable()) {
			col += 3; // |no
		}
	}
	else if (value()->isNegatable()) {
		col += 5; // [no-]
	}
	return col;
}